

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

char * helicsFilterGetPropertyString(HelicsFilter filt,char *prop)

{
  bool bVar1;
  long in_RSI;
  string res;
  FilterObject *fObj;
  Filter *__str;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined1 local_40 [32];
  FilterObject *local_20;
  long local_18;
  char *local_8;
  
  local_18 = in_RSI;
  local_20 = anon_unknown.dwarf_88686::getFilterObj
                       (in_stack_ffffffffffffffa8,
                        (HelicsError *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                       );
  if ((local_20 == (FilterObject *)0x0) || (local_18 == 0)) {
    local_8 = "";
  }
  else {
    __str = local_20->filtPtr;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    (*(__str->super_Interface)._vptr_Interface[7])
              (local_40,__str,in_stack_ffffffffffffffb0,local_48);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e7486
                      );
    if (bVar1) {
      local_8 = "";
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
      local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,1));
  }
  return local_8;
}

Assistant:

const char* helicsFilterGetPropertyString(HelicsFilter filt, const char* prop)
{
    static constexpr char nullStr[] = "";
    auto* fObj = getFilterObj(filt, nullptr);
    if (fObj == nullptr || prop == nullptr) {
        return nullStr;
    }
    try {
        auto res = fObj->filtPtr->getString(prop);
        if (res.empty()) {
            return nullStr;
        }
        fObj->buffer = res;
        return fObj->buffer.c_str();
    }
    catch (...) {
        return nullStr;
    }
}